

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
          (Recycled<Kernel::RobSubstitution,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *this)

{
  _Head_base<0UL,_Kernel::RobSubstitution_*,_false> this_00;
  RobSubstitution *in_RAX;
  Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
  *this_01;
  _Head_base<0UL,_Kernel::RobSubstitution_*,_false> local_18;
  
  this_00._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
       ._M_t.
       super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
       .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl;
  local_18._M_head_impl = in_RAX;
  if ((this_00._M_head_impl != (RobSubstitution *)0x0) &&
     (((0 < *(int *)((long)&(this_00._M_head_impl)->_bindings + 0x10) ||
       (0 < *(int *)((long)&(this_00._M_head_impl)->_outputVarBindings + 0x10))) &&
      (Recycled<Kernel::RobSubstitution,Lib::DefaultReset,Lib::DefaultKeepRecycled>::memAlive ==
       '\x01')))) {
    Kernel::RobSubstitution::reset(this_00._M_head_impl);
    this_01 = mem();
    local_18._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
         ._M_t.
         super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
         .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>.
    _M_t.
    super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
    .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl = (RobSubstitution *)0x0;
    if (this_01->_cursor == this_01->_end) {
      Stack<std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>_>
      ::expand(this_01);
    }
    (this_01->_cursor->_M_t).
    super___uniq_ptr_impl<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>.
    _M_t.
    super__Tuple_impl<0UL,_Kernel::RobSubstitution_*,_std::default_delete<Kernel::RobSubstitution>_>
    .super__Head_base<0UL,_Kernel::RobSubstitution_*,_false>._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (RobSubstitution *)0x0;
    this_01->_cursor = this_01->_cursor + 1;
    std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
    ~unique_ptr((unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>
                 *)&local_18);
  }
  std::unique_ptr<Kernel::RobSubstitution,_std::default_delete<Kernel::RobSubstitution>_>::
  ~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }